

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamahaCommands.hpp
# Opt level: O2

void __thiscall TI::TMS::Commands::Line::~Line(Line *this)

{
  operator_delete(this,0x38);
  return;
}

Assistant:

Line(CommandContext &context, ModeDescription &mode_description) : Command(context, mode_description) {
			// context.destination = start position;
			// context.size.v[0] = long side dots;
			// context.size.v[1] = short side dots;
			// context.arguments => direction

			position_ = context.size.v[1];
			numerator_ = position_ << 1;
			denominator_ = context.size.v[0] << 1;

			cycles = 32;
			access = AccessType::PlotPoint;
		}